

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaValidateSetFilename(xmlSchemaValidCtxtPtr vctxt,char *filename)

{
  xmlChar *pxVar1;
  char *filename_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  if (vctxt != (xmlSchemaValidCtxtPtr)0x0) {
    if (vctxt->filename != (char *)0x0) {
      (*xmlFree)(vctxt->filename);
    }
    if (filename == (char *)0x0) {
      vctxt->filename = (char *)0x0;
    }
    else {
      pxVar1 = xmlStrdup((xmlChar *)filename);
      vctxt->filename = (char *)pxVar1;
    }
  }
  return;
}

Assistant:

void
xmlSchemaValidateSetFilename(xmlSchemaValidCtxtPtr vctxt, const char *filename) {
    if (vctxt == NULL)
        return;
    if (vctxt->filename != NULL)
        xmlFree(vctxt->filename);
    if (filename != NULL)
        vctxt->filename = (char *) xmlStrdup((const xmlChar *) filename);
    else
        vctxt->filename = NULL;
}